

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O2

void __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
::set_main_paging(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
                  *this)

{
  bool bVar1;
  Region RVar2;
  bool bVar3;
  MainState previous_state;
  MainState local_10;
  
  local_10.region_20_40 = (this->main_state_).region_20_40;
  local_10.base = (this->main_state_).base;
  local_10.region_04_08 = (this->main_state_).region_04_08;
  bVar3 = (this->switches_).write_auxiliary_memory;
  (this->main_state_).base.read = (this->switches_).read_auxiliary_memory;
  (this->main_state_).base.write = bVar3;
  if ((this->switches_).store_80 == true) {
    bVar3 = (this->switches_).video_page_2;
    bVar1 = (this->switches_).high_resolution;
    (this->main_state_).region_04_08.write = bVar3;
    (this->main_state_).region_04_08.read = bVar3;
    if (bVar1 == true) {
      (this->main_state_).region_20_40.write = bVar3;
      (this->main_state_).region_20_40.read = bVar3;
    }
    else {
      (this->main_state_).region_20_40 = (this->main_state_).base;
    }
  }
  else {
    RVar2 = (this->main_state_).base;
    (this->main_state_).region_20_40 = RVar2;
    (this->main_state_).region_04_08 = RVar2;
  }
  bVar3 = MainState::operator!=(&local_10,&this->main_state_);
  if (bVar3) {
    ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>::set_paging<1>
              (this->machine_);
  }
  return;
}

Assistant:

void set_main_paging() {
			const auto previous_state = main_state_;

			// The two appropriately named switches provide the base case.
			main_state_.base.read = switches_.read_auxiliary_memory;
			main_state_.base.write = switches_.write_auxiliary_memory;

			if(switches_.store_80) {
				// If store 80 is set, use the page 2 flag for the lower carve out;
				// if both store 80 and high resolution are set, use the page 2 flag for both carve outs.
				main_state_.region_04_08.read = main_state_.region_04_08.write = switches_.video_page_2;

				if(switches_.high_resolution) {
					main_state_.region_20_40.read = main_state_.region_20_40.write = switches_.video_page_2;
				} else {
					main_state_.region_20_40 = main_state_.base;
				}
			} else {
				main_state_.region_04_08 = main_state_.region_20_40 = main_state_.base;
			}

			if(previous_state != main_state_) {
				machine_.template set_paging<PagingType::Main>();
			}
		}